

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O3

array<float,_4> __thiscall pbrt::HairBxDF::ComputeApPDF(HairBxDF *this,Float cosTheta_o)

{
  Float FVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  SampledSpectrum SVar7;
  SampledSpectrum *pSVar8;
  int i_1;
  long lVar9;
  int i_3;
  int i;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar13 [64];
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_XMM6 [16];
  array<float,_4> aVar18;
  array<float,_4> apPDF;
  array<pbrt::SampledSpectrum,_4> ap;
  SampledSpectrum T;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78 [4];
  SampledSpectrum local_68 [4];
  SampledSpectrum local_20;
  
  auVar13._4_60_ = in_register_00001204;
  auVar13._0_4_ = cosTheta_o;
  FVar1 = this->eta;
  auVar6 = vfnmadd213ss_fma(auVar13._0_16_,auVar13._0_16_,SUB6416(ZEXT464(0x3f800000),0));
  auVar6 = vmaxss_avx(auVar6,ZEXT816(0) << 0x40);
  auVar11 = vsqrtss_avx(auVar6,auVar6);
  auVar6 = vfmsub231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar11._0_4_)),ZEXT416((uint)FVar1),
                           ZEXT416((uint)FVar1));
  auVar2 = vmaxss_avx(auVar6,ZEXT816(0) << 0x40);
  auVar6._0_4_ = this->h;
  auVar6._4_4_ = this->gamma_o;
  auVar6._8_4_ = this->eta;
  auVar6._12_4_ = (this->sigma_a).values.values[0];
  auVar2 = vsqrtss_avx(auVar2,auVar2);
  auVar6 = vinsertps_avx(auVar6,auVar11,0x10);
  auVar11._0_4_ = auVar2._0_4_ / cosTheta_o;
  auVar11._4_12_ = auVar2._4_12_;
  auVar12._0_12_ = ZEXT812(0);
  auVar12._12_4_ = 0;
  auVar2 = vinsertps_avx(auVar11,ZEXT416((uint)FVar1),0x10);
  auVar6 = vdivps_avx(auVar6,auVar2);
  auVar16._8_4_ = 0x3f800000;
  auVar16._0_8_ = 0x3f8000003f800000;
  auVar16._12_4_ = 0x3f800000;
  auVar17._0_4_ = auVar6._0_4_ * auVar6._0_4_;
  auVar17._4_4_ = auVar6._4_4_ * auVar6._4_4_;
  auVar17._8_4_ = auVar6._8_4_ * auVar6._8_4_;
  auVar17._12_4_ = auVar6._12_4_ * auVar6._12_4_;
  auVar11 = vsubps_avx(auVar16,auVar17);
  uVar3 = vcmpps_avx512vl(auVar12,auVar11,1);
  auVar2 = vmovshdup_avx(auVar11);
  local_88._4_12_ = auVar2._4_12_;
  local_88._0_4_ = (uint)((byte)(uVar3 >> 1) & 1) * auVar2._0_4_;
  local_98._4_12_ = auVar11._4_12_;
  local_98._0_4_ = (uint)((byte)uVar3 & 1) * auVar11._0_4_;
  auVar2 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar6);
  uVar4 = vcmpss_avx512f(auVar6,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar5 = (bool)((byte)uVar4 & 1);
  asinf((float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * auVar2._0_4_));
  lVar10 = 0;
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar11 = vxorps_avx512vl(*(undefined1 (*) [16])(this->sigma_a).values.values,auVar2);
  auVar6 = vsqrtss_avx(in_XMM6,ZEXT416((uint)local_98._0_4_));
  auVar2 = vsqrtss_avx(in_XMM6,ZEXT416((uint)local_88._0_4_));
  fVar14 = (auVar6._0_4_ + auVar6._0_4_) / auVar2._0_4_;
  local_78[0] = fVar14 * auVar11._0_4_;
  local_78[1] = fVar14 * auVar11._4_4_;
  local_78[2] = fVar14 * auVar11._8_4_;
  local_78[3] = fVar14 * auVar11._12_4_;
  local_68[0].values.values = (array<float,_4>)(array<float,_4>)(ZEXT416(0) << 0x20);
  do {
    fVar14 = expf(local_78[lVar10]);
    local_68[0].values.values[lVar10] = fVar14;
    SVar7.values.values = local_68[0].values.values;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  pSVar8 = local_68;
  local_20.values.values[0] = local_68[0].values.values[0];
  local_20.values.values[1] = local_68[0].values.values[1];
  local_20.values.values[2] = local_68[0].values.values[2];
  local_20.values.values[3] = local_68[0].values.values[3];
  local_68[0].values.values = SVar7.values.values;
  Ap((array<pbrt::SampledSpectrum,_4> *)pSVar8,cosTheta_o,this->eta,this->h,&local_20);
  lVar10 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  fVar14 = 0.0;
  do {
    fVar15 = *(float *)((long)local_68[0].values.values + lVar10);
    lVar9 = 1;
    do {
      fVar15 = fVar15 + (((SampledSpectrum *)&pSVar8->values)->values).values[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    lVar10 = lVar10 + 0x10;
    pSVar8 = pSVar8 + 1;
    fVar14 = fVar14 + fVar15 * 0.25;
  } while (lVar10 != 0x40);
  pSVar8 = local_68;
  lVar10 = 0;
  do {
    fVar15 = local_68[lVar10].values.values[0];
    lVar9 = 1;
    do {
      fVar15 = fVar15 + (pSVar8->values).values[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    pSVar8 = pSVar8 + 1;
    *(float *)((long)&local_a8 + lVar10 * 4) = (fVar15 * 0.25) / fVar14;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  aVar18.values[0] = (float)(undefined4)local_a8;
  aVar18.values[1] = (float)local_a8._4_4_;
  aVar18.values[2] = (float)(undefined4)uStack_a0;
  aVar18.values[3] = (float)uStack_a0._4_4_;
  return (array<float,_4>)aVar18.values;
}

Assistant:

pstd::array<Float, HairBxDF::pMax + 1> HairBxDF::ComputeApPDF(Float cosTheta_o) const {
    // Compute array of $A_p$ values for _cosThetaO_
    Float sinTheta_o = SafeSqrt(1 - cosTheta_o * cosTheta_o);
    // Compute $\cos \thetat$ for refracted ray
    Float sinTheta_t = sinTheta_o / eta;
    Float cosTheta_t = SafeSqrt(1 - Sqr(sinTheta_t));

    // Compute $\gammat$ for refracted ray
    Float etap = SafeSqrt(eta * eta - Sqr(sinTheta_o)) / cosTheta_o;
    Float sinGamma_t = h / etap;
    Float cosGamma_t = SafeSqrt(1 - Sqr(sinGamma_t));
    Float gamma_t = SafeASin(sinGamma_t);

    // Compute the transmittance _T_ of a single path through the cylinder
    SampledSpectrum T = Exp(-sigma_a * (2 * cosGamma_t / cosTheta_t));

    pstd::array<SampledSpectrum, pMax + 1> ap = Ap(cosTheta_o, eta, h, T);

    // Compute $A_p$ PDF from individual $A_p$ terms
    pstd::array<Float, pMax + 1> apPDF;
    Float sumY = 0;
    for (const SampledSpectrum &as : ap)
        sumY += as.Average();
    for (int i = 0; i <= pMax; ++i)
        apPDF[i] = ap[i].Average() / sumY;

    return apPDF;
}